

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O0

void * Pt_CallbackProc(void *p)

{
  code *pcVar1;
  __uid_t _Var2;
  PtTimestamp PVar3;
  int local_34;
  undefined1 auStack_30 [4];
  int delay;
  timeval timeout;
  int mytime;
  pt_callback_parameters *parameters;
  void *p_local;
  
  timeout.tv_usec._4_4_ = 1;
  _Var2 = geteuid();
  if (_Var2 == 0) {
    setpriority(PRIO_PROCESS,0,-0x14);
  }
  while (pt_callback_proc_id == *p) {
    local_34 = timeout.tv_usec._4_4_ * *(int *)((long)p + 4);
    timeout.tv_usec._4_4_ = timeout.tv_usec._4_4_ + 1;
    PVar3 = Pt_Time();
    local_34 = local_34 - PVar3;
    if (local_34 < 0) {
      local_34 = 0;
    }
    _auStack_30 = 0;
    timeout.tv_sec = (__time_t)(local_34 * 1000);
    select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_30);
    pcVar1 = *(code **)((long)p + 8);
    PVar3 = Pt_Time();
    (*pcVar1)(PVar3,*(undefined8 *)((long)p + 0x10));
  }
  return (void *)0x0;
}

Assistant:

static void *Pt_CallbackProc(void *p)
{
    pt_callback_parameters *parameters = (pt_callback_parameters *) p;
    int mytime = 1;
    /* to kill a process, just increment the pt_callback_proc_id */
    /* printf("pt_callback_proc_id %d, id %d\n", pt_callback_proc_id,
           parameters->id); */
    if (geteuid() == 0) setpriority(PRIO_PROCESS, 0, -20);
    while (pt_callback_proc_id == parameters->id) {
        /* wait for a multiple of resolution ms */
        struct timeval timeout;
        int delay = mytime++ * parameters->resolution - Pt_Time();
        if (delay < 0) delay = 0;
        timeout.tv_sec = 0;
        timeout.tv_usec = delay * 1000;
        select(0, NULL, NULL, NULL, &timeout);
        (*(parameters->callback))(Pt_Time(), parameters->userData);
    }
    /* printf("Pt_CallbackProc exiting\n"); */
    // free(parameters);
    return NULL;
}